

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_50;
  ColourGuard local_20;
  AssertionPrinter *local_10;
  AssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    poVar2 = this->stream;
    ColourImpl::guardColour((ColourImpl *)&local_20,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_20);
    std::operator<<(poVar2," for: ");
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
    poVar2 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_50,this->result);
    std::operator<<(poVar2,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << colourImpl->guardColour(compactDimColour) << " for: ";
            stream << result.getExpandedExpression();
        }
    }